

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O1

void __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::less<void>_>
::next_semiintersection
          (semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::less<void>_>
           *this)

{
  int iVar1;
  iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *piVar2;
  size_t sVar3;
  int *piVar4;
  int *piVar5;
  outer_range_iterator oVar6;
  
  do {
    oVar6._M_current = (this->m_begin)._M_current;
    if (oVar6._M_current == (this->m_end)._M_current) {
      return;
    }
    oVar6 = skip_while_less(this,oVar6,oVar6._M_current + (this->m_min_items - 1));
    piVar2 = (this->m_begin)._M_current;
    sVar3 = this->m_min_items;
    piVar4 = ((oVar6._M_current)->
             super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
             ).
             super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
             .
             super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
             .m_Begin._M_current;
    piVar5 = ((oVar6._M_current)->
             super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
             ).
             super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
             .
             super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
             .m_End._M_current;
    if (oVar6._M_current == piVar2 + (sVar3 - 1)) {
      if ((piVar4 == piVar5) ||
         (piVar5 = piVar2[sVar3 - 1].
                   super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
                   .
                   super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
                   .
                   super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
                   .m_Begin._M_current,
         piVar5 == piVar2[sVar3 - 1].
                   super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
                   .
                   super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
                   .
                   super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
                   .m_End._M_current)) {
LAB_002491dd:
        __assert_fail("!empty()","/usr/include/boost/range/iterator_range_core.hpp",0xff,
                      "reference boost::iterator_range_detail::iterator_range_base<__gnu_cxx::__normal_iterator<int *, std::vector<int>>, boost::iterators::incrementable_traversal_tag>::front() const [IteratorT = __gnu_cxx::__normal_iterator<int *, std::vector<int>>, TraversalTag = boost::iterators::incrementable_traversal_tag]"
                     );
      }
      iVar1 = *piVar5;
      if (*piVar4 < iVar1) {
        __assert_fail("not m_compare(skipped_until->front(), semiintersection_candidate()->front())"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                      ,0xf9,
                      "void burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>> *, std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>>>>::next_semiintersection() [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>> *, std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>>>, Compare = std::less<void>]"
                     );
      }
      if (iVar1 < *piVar4) {
        __assert_fail("not m_compare(semiintersection_candidate()->front(), skipped_until->front())"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                      ,0xfa,
                      "void burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>> *, std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>>>>::next_semiintersection() [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>> *, std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>>>, Compare = std::less<void>]"
                     );
      }
    }
    else if (piVar4 == piVar5) {
      drop_empty_range(this,oVar6);
    }
    else {
      piVar5 = piVar2[sVar3 - 1].
               super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
               .
               super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
               .m_Begin._M_current;
      if (piVar5 == piVar2[sVar3 - 1].
                    super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
                    .
                    super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
                    .
                    super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
                    .m_End._M_current) goto LAB_002491dd;
      if (*piVar4 <= *piVar5) {
        __assert_fail("m_compare(semiintersection_candidate()->front(), skipped_until->front())",
                      "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                      ,0x103,
                      "void burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>> *, std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>>>>::next_semiintersection() [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>> *, std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>>>, Compare = std::less<void>]"
                     );
      }
      maintain_invariant(this);
    }
    if (oVar6._M_current == piVar2 + (sVar3 - 1)) {
      return;
    }
  } while( true );
}

Assistant:

void next_semiintersection ()
        {
            while (not is_end())
            {
                auto skipped_until = skip_while_less(m_begin, semiintersection_candidate());
                if (skipped_until == semiintersection_candidate())
                {
                    BOOST_ASSERT(not m_compare(skipped_until->front(), semiintersection_candidate()->front()));
                    BOOST_ASSERT(not m_compare(semiintersection_candidate()->front(), skipped_until->front()));
                    break; // Полупересечение найдено.
                }
                else if (skipped_until->empty())
                {
                    drop_empty_range(skipped_until);
                }
                else // Текущий диапазон больше кандидата.
                {
                    BOOST_ASSERT(m_compare(semiintersection_candidate()->front(), skipped_until->front()));
                    maintain_invariant();
                }
            }
        }